

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::tag_scalar_t<int,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<int,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  undefined8 *puVar1;
  tag_t<cfgfile::qstring_trait_t> *this_00;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  exception_t<cfgfile::qstring_trait_t> *peVar4;
  undefined8 *puVar5;
  allocator<char> local_23d;
  allocator<char> local_23c;
  allocator<char> local_23b;
  allocator<char> local_23a;
  allocator<char> local_239;
  string_t local_238;
  string_t local_220;
  qstring_wrapper_t local_208;
  qstring_wrapper_t local_1f0;
  qstring_wrapper_t local_1d8;
  qstring_wrapper_t local_1c0;
  qstring_wrapper_t local_1a8;
  qstring_wrapper_t local_190;
  qstring_wrapper_t local_178;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string_t local_c0;
  string_t local_a8;
  string_t local_90;
  string_t local_78;
  qstring_wrapper_t local_60;
  qstring_wrapper_t local_48;
  
  if ((this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined == false) {
    peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,"Undefined value of tag: \"",(allocator<char> *)&local_78);
    qstring_trait_t::from_ascii(&local_1d8,&local_e0);
    operator+(&local_1c0,&local_1d8,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"\". In file \"",(allocator<char> *)&local_90);
    qstring_trait_t::from_ascii(&local_1f0,&local_100);
    operator+(&local_1a8,&local_1c0,&local_1f0);
    operator+(&local_190,&local_1a8,&info->m_file_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,"\" on line ",(allocator<char> *)&local_a8);
    qstring_trait_t::from_ascii(&local_208,&local_120);
    operator+(&local_178,&local_190,&local_208);
    qstring_trait_t::to_string(&local_220,info->m_line_number);
    operator+((qstring_wrapper_t *)&local_160,&local_178,&local_220);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_140,".",(allocator<char> *)&local_c0);
    qstring_trait_t::from_ascii(&local_238,&local_140);
    operator+(&local_48,(qstring_wrapper_t *)&local_160,&local_238);
    exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_48);
    __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  iVar3 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
  puVar5 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
  puVar1 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar3))[1];
  do {
    if (puVar5 == puVar1) {
      return;
    }
    this_00 = (tag_t<cfgfile::qstring_trait_t> *)*puVar5;
    if (this_00->m_is_mandatory == true) {
      bVar2 = tag_t<cfgfile::qstring_trait_t>::is_defined(this_00);
      if (!bVar2) {
        peVar4 = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"Undefined child mandatory tag: \"",&local_239);
        qstring_trait_t::from_ascii(&local_220,&local_e0);
        operator+(&local_208,&local_220,&this_00->m_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_100,"\". Where parent is: \"",&local_23a);
        qstring_trait_t::from_ascii(&local_238,&local_100);
        operator+(&local_1f0,&local_208,&local_238);
        operator+(&local_1d8,&local_1f0,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"\". In file \"",&local_23b);
        qstring_trait_t::from_ascii(&local_78,&local_120);
        operator+(&local_1c0,&local_1d8,&local_78);
        operator+(&local_1a8,&local_1c0,&info->m_file_name);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_140,"\" on line ",&local_23c);
        qstring_trait_t::from_ascii(&local_90,&local_140);
        operator+(&local_190,&local_1a8,&local_90);
        qstring_trait_t::to_string(&local_a8,info->m_line_number);
        operator+(&local_178,&local_190,&local_a8);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,".",&local_23d);
        qstring_trait_t::from_ascii(&local_c0,&local_160);
        operator+(&local_60,&local_178,&local_c0);
        exception_t<cfgfile::qstring_trait_t>::exception_t(peVar4,&local_60);
        __cxa_throw(peVar4,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                    exception_t<cfgfile::qstring_trait_t>::~exception_t);
      }
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}